

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,uint64_t typeId,uint16_t methodId)

{
  undefined6 in_register_0000000a;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  unsigned_short *in_stack_fffffffffffffe58;
  uint16_t methodId_local;
  Array<char> local_198;
  uint64_t typeId_local;
  char *interfaceName_local;
  Exception local_170;
  
  typeId_local = CONCAT62(in_register_0000000a,methodId);
  interfaceName_local = (char *)typeId;
  kj::_::Debug::makeDescription<char_const(&)[24],char_const*&,unsigned_long&,unsigned_short&>
            ((String *)&local_198,
             (Debug *)"\"Method not implemented.\", interfaceName, typeId, methodId",
             "Method not implemented.",(char (*) [24])&interfaceName_local,(char **)&typeId_local,
             (unsigned_long *)&methodId_local,in_stack_fffffffffffffe58);
  kj::Exception::Exception
            (&local_170,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x50,(String *)&local_198);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_170);
  kj::Exception::~Exception(&local_170);
  kj::Array<char>::~Array(&local_198);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* interfaceName, uint64_t typeId, uint16_t methodId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName, typeId, methodId);
}